

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.cpp
# Opt level: O2

void pica::assertionFailed(char *expr,char *file,long line)

{
  string message;
  allocator<char> local_132;
  allocator<char> local_131;
  long local_130;
  string local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_28;
  
  local_130 = line;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e8,expr,&local_131);
  std::operator+(&local_c8,"ERROR: assertion \"",&local_e8);
  std::operator+(&local_a8,&local_c8,"\" at ");
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_108,file,&local_132);
  std::operator+(&local_88,&local_a8,&local_108);
  std::operator+(&local_68,&local_88,":");
  toString<long>(&local_128,&local_130);
  std::operator+(&local_48,&local_68,&local_128);
  std::operator+(&local_28,&local_48," failed");
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_128);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::operator<<((ostream *)&std::cerr,(string *)&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  return;
}

Assistant:

void assertionFailed(const char* expr, const char* file, long line)
{
    std::string message = "ERROR: assertion \"" + std::string(expr) + "\" at " + std::string(file) + ":" +
        toString(line) + " failed";
    std::cerr << message;
}